

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

DisasASI get_asi(DisasContext_conflict8 *dc,int insn,MemOp_conflict1 memop)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  MemOp_conflict1 MVar5;
  DisasASI DVar7;
  ulong uVar6;
  
  uVar3 = (ulong)memop;
  if (((uint)insn >> 0xd & 1) == 0) {
    MVar5 = (uint)insn >> 5 & 0xff;
  }
  else {
    MVar5 = dc->asi;
  }
  uVar6 = (ulong)MVar5;
  uVar4 = dc->mem_idx;
  if ((int)MVar5 < 0x80 && (dc->supervisor == false && dc->hypervisor == false)) {
    gen_exception(dc,0x37);
    uVar1 = 1;
    goto LAB_00a47f7a;
  }
  if ((int)MVar5 < 0x81) {
    switch(MVar5) {
    case MO_ASHIFT:
    case MO_BE|MO_ASHIFT:
    case MO_ALIGN_4|MO_ASHIFT:
    case MO_ALIGN_4|MO_SSIZE:
    case MO_ALIGN_4|MO_BE|MO_ASHIFT:
    case MO_ALIGN_4|MO_BESL|MO_16:
      uVar4 = dc->hypervisor | 4;
      break;
    case MO_LESW:
    case MO_LESL:
    case MO_SSIZE:
    case MO_BE:
    case MO_BEUW:
    case MO_BEUL:
    case MO_BEQ:
    case MO_BESW:
    case MO_BESL:
    case MO_BESL|MO_16:
    case MO_ALIGN_2|MO_32:
    case MO_ALIGN_2|MO_64:
    case MO_ALIGN_2|MO_BEUL:
    case MO_ALIGN_2|MO_BEQ:
    case MO_ALIGN_4:
    case MO_ALIGN_4|MO_16:
    case MO_ALIGN_4|MO_LESW:
    case MO_ALIGN_4|MO_BE:
    case MO_ALIGN_4|MO_BEUW:
    case MO_ALIGN_4|MO_BESW:
    case MO_ALIGN_8:
    case MO_ALIGN_8|MO_16:
    case MO_ALIGN_8|MO_32:
    case MO_ALIGN_8|MO_64:
    case MO_ALIGN_8|MO_LESW:
    case MO_ALIGN_8|MO_LESL:
    case MO_ALIGN_8|MO_SSIZE:
    case MO_ALIGN_8|MO_BE:
    case MO_ALIGN_8|MO_BEUW:
    case MO_ALIGN_8|MO_BEUL:
    case MO_ALIGN_8|MO_BEQ:
      break;
    case MO_ALIGN_2:
    case MO_ALIGN_2|MO_LESL:
    case MO_ALIGN_2|MO_BE:
    case MO_ALIGN_2|MO_BESL:
    case MO_ALIGN_4|MO_32:
    case MO_ALIGN_4|MO_BEUL:
switchD_00a47e54_caseD_10:
      uVar4 = 0;
      break;
    case MO_ALIGN_2|MO_16:
    case MO_ALIGN_2|MO_SSIZE:
    case MO_ALIGN_2|MO_BEUW:
    case MO_ALIGN_2|MO_BESL|MO_16:
    case MO_ALIGN_4|MO_64:
    case MO_ALIGN_4|MO_BEQ:
switchD_00a47e54_caseD_11:
      uVar4 = 1;
      break;
    case MO_ALIGN_2|MO_ASHIFT:
    case MO_ALIGN_2|MO_LESW:
    case MO_ALIGN_2|MO_BE|MO_ASHIFT:
    case MO_ALIGN_2|MO_BESW:
    case MO_ALIGN_4|MO_LESL:
    case MO_ALIGN_4|MO_BESL:
    case MO_ALIGN_8|MO_ASHIFT:
    case MO_ALIGN_8|MO_BE|MO_ASHIFT:
      uVar4 = 5;
      break;
    default:
      switch(MVar5) {
      case MO_AMASK:
      case MO_AMASK|MO_BE:
        goto switchD_00a47e54_caseD_10;
      case MO_AMASK|MO_16:
      case MO_AMASK|MO_BEUW:
        goto switchD_00a47e54_caseD_11;
      }
    }
  }
  else if ((((MVar5 - 0xd1 < 0x29) && ((0x10104050505U >> ((ulong)(MVar5 - 0xd1) & 0x3f) & 1) != 0))
           || (MVar5 == 0x81)) || (MVar5 == 0x89)) {
    if (uVar4 == 0) goto switchD_00a47e54_caseD_11;
    if (uVar4 == 2) {
      uVar4 = 3;
    }
  }
  if (MVar5 < (MO_ALIGN_8|MO_BESW)) {
    if ((0x1010dcdc00000000U >> (uVar6 & 0x3f) & 1) != 0) goto switchD_00a47ede_caseD_e2;
    if ((0x33331010UL >> (uVar6 & 0x3f) & 1) == 0) {
      if ((0xc0c00000UL >> (uVar6 & 0x3f) & 1) == 0) goto LAB_00a47ec2;
      goto switchD_00a47ede_caseD_e0;
    }
LAB_00a47f3b:
    uVar1 = 2;
  }
  else {
LAB_00a47ec2:
    uVar1 = 0;
    switch(MVar5) {
    case 0xd0:
    case 0xd1:
    case 0xd8:
    case 0xd9:
      uVar1 = 5;
      memop = MO_8;
      break;
    case 0xd2:
    case 0xd3:
    case 0xda:
    case 0xdb:
      uVar1 = 5;
      memop = MO_BEUW;
      break;
    case 0xd4:
    case 0xd5:
    case 0xd6:
    case 0xd7:
    case 0xdc:
    case 0xdd:
    case 0xde:
    case 0xdf:
    case 0xe4:
    case 0xe5:
    case 0xe6:
    case 0xe7:
    case 0xe8:
    case 0xe9:
    case 0xec:
    case 0xed:
    case 0xee:
    case 0xef:
    case 0xf2:
    case 0xf3:
    case 0xf4:
    case 0xf5:
    case 0xf6:
    case 0xf7:
      break;
    case 0xe0:
    case 0xe1:
    case 0xf0:
    case 0xf1:
    case 0xf8:
    case 0xf9:
switchD_00a47ede_caseD_e0:
      uVar1 = 4;
      break;
    case 0xe2:
    case 0xe3:
    case 0xea:
    case 0xeb:
switchD_00a47ede_caseD_e2:
      uVar1 = 3;
      break;
    default:
      uVar2 = MVar5 - MO_AMASK;
      if (uVar2 < 0x1a) {
        if ((0x303U >> (uVar2 & 0x1f) & 1) != 0) goto switchD_00a47ede_caseD_e0;
        if ((0x3030000U >> (uVar2 & 0x1f) & 1) != 0) goto LAB_00a47f3b;
      }
    }
  }
  uVar3 = (ulong)(memop ^ MVar5 & MO_BE);
LAB_00a47f7a:
  uVar1 = uVar6 << 0x20 | uVar1;
  DVar7._8_8_ = (ulong)uVar4 | uVar3 << 0x20;
  DVar7.type = (int)uVar1;
  DVar7.asi = (int)(uVar1 >> 0x20);
  return DVar7;
}

Assistant:

static DisasASI get_asi(DisasContext *dc, int insn, MemOp memop)
{
    int asi = GET_FIELD(insn, 19, 26);
    ASIType type = GET_ASI_HELPER;
    int mem_idx = dc->mem_idx;

#ifndef TARGET_SPARC64
    /* Before v9, all asis are immediate and privileged.  */
    if (IS_IMM) {
        gen_exception(dc, TT_ILL_INSN);
        type = GET_ASI_EXCP;
    } else if (supervisor(dc)
               /* Note that LEON accepts ASI_USERDATA in user mode, for
                  use with CASA.  Also note that previous versions of
                  QEMU allowed (and old versions of gcc emitted) ASI_P
                  for LEON, which is incorrect.  */
               || (asi == ASI_USERDATA
                   && (dc->def->features & CPU_FEATURE_CASA))) {
        switch (asi) {
        case ASI_USERDATA:   /* User data access */
            mem_idx = MMU_USER_IDX;
            type = GET_ASI_DIRECT;
            break;
        case ASI_KERNELDATA: /* Supervisor data access */
            mem_idx = MMU_KERNEL_IDX;
            type = GET_ASI_DIRECT;
            break;
        case ASI_M_BYPASS:    /* MMU passthrough */
        case ASI_LEON_BYPASS: /* LEON MMU passthrough */
            mem_idx = MMU_PHYS_IDX;
            type = GET_ASI_DIRECT;
            break;
        case ASI_M_BCOPY: /* Block copy, sta access */
            mem_idx = MMU_KERNEL_IDX;
            type = GET_ASI_BCOPY;
            break;
        case ASI_M_BFILL: /* Block fill, stda access */
            mem_idx = MMU_KERNEL_IDX;
            type = GET_ASI_BFILL;
            break;
        }

        /* MMU_PHYS_IDX is used when the MMU is disabled to passthrough the
         * permissions check in get_physical_address(..).
         */
        mem_idx = (dc->mem_idx == MMU_PHYS_IDX) ? MMU_PHYS_IDX : mem_idx;
    } else {
        gen_exception(dc, TT_PRIV_INSN);
        type = GET_ASI_EXCP;
    }
#else
    if (IS_IMM) {
        asi = dc->asi;
    }
    /* With v9, all asis below 0x80 are privileged.  */
    /* ??? We ought to check cpu_has_hypervisor, but we didn't copy
       down that bit into DisasContext.  For the moment that's ok,
       since the direct implementations below doesn't have any ASIs
       in the restricted [0x30, 0x7f] range, and the check will be
       done properly in the helper.  */
    if (!supervisor(dc) && asi < 0x80) {
        gen_exception(dc, TT_PRIV_ACT);
        type = GET_ASI_EXCP;
    } else {
        switch (asi) {
        case ASI_REAL:      /* Bypass */
        case ASI_REAL_IO:   /* Bypass, non-cacheable */
        case ASI_REAL_L:    /* Bypass LE */
        case ASI_REAL_IO_L: /* Bypass, non-cacheable LE */
        case ASI_TWINX_REAL:   /* Real address, twinx */
        case ASI_TWINX_REAL_L: /* Real address, twinx, LE */
        case ASI_QUAD_LDD_PHYS:
        case ASI_QUAD_LDD_PHYS_L:
            mem_idx = MMU_PHYS_IDX;
            break;
        case ASI_N:  /* Nucleus */
        case ASI_NL: /* Nucleus LE */
        case ASI_TWINX_N:
        case ASI_TWINX_NL:
        case ASI_NUCLEUS_QUAD_LDD:
        case ASI_NUCLEUS_QUAD_LDD_L:
            if (hypervisor(dc)) {
                mem_idx = MMU_PHYS_IDX;
            } else {
                mem_idx = MMU_NUCLEUS_IDX;
            }
            break;
        case ASI_AIUP:  /* As if user primary */
        case ASI_AIUPL: /* As if user primary LE */
        case ASI_TWINX_AIUP:
        case ASI_TWINX_AIUP_L:
        case ASI_BLK_AIUP_4V:
        case ASI_BLK_AIUP_L_4V:
        case ASI_BLK_AIUP:
        case ASI_BLK_AIUPL:
            mem_idx = MMU_USER_IDX;
            break;
        case ASI_AIUS:  /* As if user secondary */
        case ASI_AIUSL: /* As if user secondary LE */
        case ASI_TWINX_AIUS:
        case ASI_TWINX_AIUS_L:
        case ASI_BLK_AIUS_4V:
        case ASI_BLK_AIUS_L_4V:
        case ASI_BLK_AIUS:
        case ASI_BLK_AIUSL:
            mem_idx = MMU_USER_SECONDARY_IDX;
            break;
        case ASI_S:  /* Secondary */
        case ASI_SL: /* Secondary LE */
        case ASI_TWINX_S:
        case ASI_TWINX_SL:
        case ASI_BLK_COMMIT_S:
        case ASI_BLK_S:
        case ASI_BLK_SL:
        case ASI_FL8_S:
        case ASI_FL8_SL:
        case ASI_FL16_S:
        case ASI_FL16_SL:
            if (mem_idx == MMU_USER_IDX) {
                mem_idx = MMU_USER_SECONDARY_IDX;
            } else if (mem_idx == MMU_KERNEL_IDX) {
                mem_idx = MMU_KERNEL_SECONDARY_IDX;
            }
            break;
        case ASI_P:  /* Primary */
        case ASI_PL: /* Primary LE */
        case ASI_TWINX_P:
        case ASI_TWINX_PL:
        case ASI_BLK_COMMIT_P:
        case ASI_BLK_P:
        case ASI_BLK_PL:
        case ASI_FL8_P:
        case ASI_FL8_PL:
        case ASI_FL16_P:
        case ASI_FL16_PL:
            break;
        }
        switch (asi) {
        case ASI_REAL:
        case ASI_REAL_IO:
        case ASI_REAL_L:
        case ASI_REAL_IO_L:
        case ASI_N:
        case ASI_NL:
        case ASI_AIUP:
        case ASI_AIUPL:
        case ASI_AIUS:
        case ASI_AIUSL:
        case ASI_S:
        case ASI_SL:
        case ASI_P:
        case ASI_PL:
            type = GET_ASI_DIRECT;
            break;
        case ASI_TWINX_REAL:
        case ASI_TWINX_REAL_L:
        case ASI_TWINX_N:
        case ASI_TWINX_NL:
        case ASI_TWINX_AIUP:
        case ASI_TWINX_AIUP_L:
        case ASI_TWINX_AIUS:
        case ASI_TWINX_AIUS_L:
        case ASI_TWINX_P:
        case ASI_TWINX_PL:
        case ASI_TWINX_S:
        case ASI_TWINX_SL:
        case ASI_QUAD_LDD_PHYS:
        case ASI_QUAD_LDD_PHYS_L:
        case ASI_NUCLEUS_QUAD_LDD:
        case ASI_NUCLEUS_QUAD_LDD_L:
            type = GET_ASI_DTWINX;
            break;
        case ASI_BLK_COMMIT_P:
        case ASI_BLK_COMMIT_S:
        case ASI_BLK_AIUP_4V:
        case ASI_BLK_AIUP_L_4V:
        case ASI_BLK_AIUP:
        case ASI_BLK_AIUPL:
        case ASI_BLK_AIUS_4V:
        case ASI_BLK_AIUS_L_4V:
        case ASI_BLK_AIUS:
        case ASI_BLK_AIUSL:
        case ASI_BLK_S:
        case ASI_BLK_SL:
        case ASI_BLK_P:
        case ASI_BLK_PL:
            type = GET_ASI_BLOCK;
            break;
        case ASI_FL8_S:
        case ASI_FL8_SL:
        case ASI_FL8_P:
        case ASI_FL8_PL:
            memop = MO_UB;
            type = GET_ASI_SHORT;
            break;
        case ASI_FL16_S:
        case ASI_FL16_SL:
        case ASI_FL16_P:
        case ASI_FL16_PL:
            memop = MO_TEUW;
            type = GET_ASI_SHORT;
            break;
        }
        /* The little-endian asis all have bit 3 set.  */
        if (asi & 8) {
            memop ^= MO_BSWAP;
        }
    }
#endif

    return (DisasASI){ type, asi, mem_idx, memop };
}